

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusQFunctionPlanner.cpp
# Opt level: O0

void __thiscall PerseusQFunctionPlanner::Plan(PerseusQFunctionPlanner *this)

{
  long *in_RDI;
  bool done;
  int iter;
  vector<double,_std::allocator<double>_> VBnew;
  vector<double,_std::allocator<double>_> VB;
  QFunctionsDiscrete Q1;
  QFunctionsDiscrete Q0;
  Perseus *in_stack_000001b0;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_stack_00000248;
  vector<double,_std::allocator<double>_> *in_stack_00000250;
  int in_stack_0000025c;
  Perseus *in_stack_00000260;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *V;
  Perseus *this_00;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  local_c8;
  byte local_ad;
  int local_ac;
  Perseus *in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  BeliefSet *in_stack_ffffffffffffff98;
  Perseus *in_stack_ffffffffffffffa0;
  Perseus *in_stack_ffffffffffffffc8;
  
  Perseus::PlanLeadIn(in_stack_ffffffffffffff60);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            *)0x9593ae);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            *)0x9593bb);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x9593c8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x9593d5);
  Perseus::GetInitialQFunctions(in_stack_ffffffffffffffc8);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::operator=((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
              (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)in_stack_fffffffffffffee8);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  BeliefValue::GetValues(in_stack_ffffffffffffff98,(QFunctionsDiscrete *)in_stack_ffffffffffffff90);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
            );
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  local_ac = 0;
  local_ad = 0;
  while (((local_ad ^ 0xff) & 1) != 0) {
    Perseus::
    PlanStartOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
              (in_stack_00000260,in_stack_0000025c,in_stack_00000250,in_stack_00000248);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator=((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *)in_stack_ffffffffffffff80,
                (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *)in_stack_ffffffffffffff78);
    (**(code **)(*in_RDI + 0x70))(&local_c8,in_RDI,in_RDI[0x18],&stack0xffffffffffffffe0);
    this_00 = (Perseus *)&stack0xffffffffffffffc8;
    V = &local_c8;
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator=((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *)in_stack_fffffffffffffee8);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    BeliefValue::GetValues
              (in_stack_ffffffffffffff98,(QFunctionsDiscrete *)in_stack_ffffffffffffff90);
    in_stack_fffffffffffffee8 = (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff98;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    in_stack_fffffffffffffef7 =
         Perseus::CheckConvergence
                   (in_stack_ffffffffffffffa0,
                    (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff98,
                    in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    if ((bool)in_stack_fffffffffffffef7) {
      local_ad = 1;
    }
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_ac = local_ac + 1;
    Perseus::
    PlanEndOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
              (this_00,V);
  }
  Perseus::PlanLeadOut(in_stack_000001b0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  return;
}

Assistant:

void PerseusQFunctionPlanner::Plan()
{
    PlanLeadIn();

    QFunctionsDiscrete Q0,Q1;
    // records the value of each belief in the belief set
    vector<double> VB,VBnew;
    
    // get initial value function
    Q1=GetInitialQFunctions();
    VB=BeliefValue::GetValues(*_m_beliefs,Q1);

    int iter=0;                      
    bool done=false;
    while(!done)
    {
        // print out some info
        PlanStartOfIteration(iter,VB,Q1);

        // the real thing: compute the next stage value function
        Q0=Q1;
        Q1=BackupStage(*_m_beliefs,Q0);

        // compute the maximum difference in the values for all
        // beliefs: for the convergence test
        VBnew=BeliefValue::GetValues(*_m_beliefs,Q1);
       
        // test for convergence
        if(CheckConvergence(VB,VBnew,iter))
            done=true;

        VB=VBnew;
        iter++;

        PlanEndOfIteration(Q1);
    }

    PlanLeadOut();
}